

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

string * util_tests::SpanToStr_abi_cxx11_(Span<const_char> *span)

{
  char *__end;
  char *__beg;
  string *in_RDI;
  long in_FS_OFFSET;
  Span<const_char> *in_stack_ffffffffffffff98;
  string *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __a = in_RDI;
  __end = Span<const_char>::begin(in_stack_ffffffffffffff98);
  __beg = Span<const_char>::end(in_stack_ffffffffffffff98);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xfffffffffffffff7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(this,__beg,__end,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string SpanToStr(const Span<const char>& span)
{
    return std::string(span.begin(), span.end());
}